

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O1

bool __thiscall
iutest::detail::PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int>::
Check<test::syntax_tests::X>
          (PropertyMatcher<int_(test::syntax_tests::X::*)()_const,_int> *this,X *actual,
          type **param_2)

{
  code *pcVar1;
  long *plVar2;
  int local_4c;
  EqMatcher<int> local_48;
  AssertionResult local_38;
  
  local_48.m_expected = &this->m_expected;
  local_48.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_003b3ce8;
  pcVar1 = (code *)*this->m_property;
  plVar2 = (long *)((long)&actual->a + this->m_property[1]);
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *plVar2 + -1);
  }
  local_4c = (*pcVar1)(plVar2);
  EqMatcher<int>::operator()(&local_38,&local_48,&local_4c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.m_message._M_dataplus._M_p != &local_38.m_message.field_2) {
    operator_delete(local_38.m_message._M_dataplus._M_p,
                    local_38.m_message.field_2._M_allocated_capacity + 1);
  }
  return local_38.m_result;
}

Assistant:

bool Check(const U& actual
        , typename detail::disable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)((actual.*m_property)()));
    }